

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSolvmin.cpp
# Opt level: O3

void __thiscall
chrono::ChOptimizerGenetic::ApplyCrossover
          (ChOptimizerGenetic *this,ChGenotype *par1,ChGenotype *par2,ChGenotype *child1,
          ChGenotype *child2)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  ulong uVar4;
  ulong uVar5;
  double *pdVar6;
  double *pdVar7;
  long size;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  ChGenotype *pCVar11;
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  ChMatrixDynamic<> mtemp;
  bool local_54;
  DenseStorage<double,__1,__1,__1,_1> local_48;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  
  local_48.m_cols = 0;
  local_48.m_data = (double *)0x0;
  local_48.m_rows = 0;
  uVar9 = (uint)(par1->genes).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                m_storage.m_rows;
  size = (long)(int)uVar9;
  if (size < 0) {
    __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                  ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,
                  "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, -1, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, -1, 1>]"
                 );
  }
  Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize(&local_48,size,size,1);
  local_54 = true;
  switch(this->crossover) {
  case ARITMETIC:
    if (0 < (int)uVar9) {
      uVar8 = 0;
      do {
        dVar12 = ChRandom();
        auVar14._0_8_ = ChRandom();
        auVar14._8_56_ = extraout_var;
        if ((((par1->genes).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
              .m_rows <= (long)uVar8) ||
            ((par2->genes).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_rows <= (long)uVar8)) ||
           ((child1->genes).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
            .m_rows <= (long)uVar8)) {
LAB_007ce380:
          __assert_fail("index >= 0 && index < size()",
                        "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                        "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                       );
        }
        auVar31._8_8_ = 0;
        auVar31._0_8_ = dVar12;
        dVar1 = (par2->genes).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                m_storage.m_data[uVar8];
        auVar18._8_8_ = 0;
        auVar18._0_8_ =
             (par1->genes).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_data[uVar8];
        auVar25._8_8_ = 0;
        auVar25._0_8_ = (1.0 - dVar12) * dVar1;
        auVar19 = vfmadd231sd_fma(auVar25,auVar18,auVar31);
        (child1->genes).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
        m_data[uVar8] = auVar19._0_8_;
        if ((child2->genes).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
            .m_rows <= (long)uVar8) goto LAB_007ce380;
        auVar21._8_8_ = 0;
        auVar21._0_8_ = (1.0 - auVar14._0_8_) * dVar1;
        auVar19 = vfmadd213sd_fma(auVar18,auVar14._0_16_,auVar21);
        (child2->genes).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
        m_data[uVar8] = auVar19._0_8_;
        uVar8 = uVar8 + 1;
      } while ((uVar9 & 0x7fffffff) != uVar8);
    }
    break;
  case BLEND:
    if (0 < (int)uVar9) {
      uVar8 = (par1->genes).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
              .m_rows;
      uVar4 = (child1->genes).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
              m_storage.m_rows;
      pdVar6 = (child1->genes).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
               m_storage.m_data;
      uVar5 = (child2->genes).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
              m_storage.m_rows;
      pdVar7 = (child2->genes).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
               m_storage.m_data;
      uVar10 = 0;
      do {
        if (((~((long)uVar8 >> 0x3f) & uVar8) == uVar10) ||
           ((par2->genes).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
            m_rows <= (long)uVar10)) goto LAB_007ce380;
        dVar12 = (par2->genes).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                 m_storage.m_data[uVar10];
        auVar30._8_8_ = 0;
        auVar30._0_8_ =
             (par1->genes).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_data[uVar10];
        auVar28._8_8_ = 0;
        auVar28._0_8_ = dVar12 * 0.30000000000000004;
        auVar19 = vfmadd231sd_fma(auVar28,auVar30,ZEXT816(0x3fe6666666666666));
        if ((~((long)uVar4 >> 0x3f) & uVar4) == uVar10) goto LAB_007ce380;
        auVar33._8_8_ = 0;
        auVar33._0_8_ = dVar12 * 0.7;
        auVar22 = vfmadd231sd_fma(auVar33,auVar30,ZEXT816(0x3fd3333333333333));
        pdVar6[uVar10] = auVar22._0_8_;
        if ((~((long)uVar5 >> 0x3f) & uVar5) == uVar10) goto LAB_007ce380;
        pdVar7[uVar10] = auVar19._0_8_;
        uVar10 = uVar10 + 1;
      } while ((uVar9 & 0x7fffffff) != uVar10);
    }
    break;
  case BLEND_RANDOM:
    dVar12 = ChRandom();
    auVar15._0_8_ = ChRandom();
    auVar15._8_56_ = extraout_var_00;
    if (0 < (int)uVar9) {
      uVar8 = (par1->genes).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
              .m_rows;
      uVar4 = (child1->genes).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
              m_storage.m_rows;
      uVar5 = (child2->genes).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
              m_storage.m_rows;
      pdVar6 = (child1->genes).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
               m_storage.m_data;
      pdVar7 = (child2->genes).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
               m_storage.m_data;
      uVar10 = 0;
      do {
        if ((((~((long)uVar8 >> 0x3f) & uVar8) == uVar10) ||
            ((par2->genes).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_rows <= (long)uVar10)) || ((~((long)uVar4 >> 0x3f) & uVar4) == uVar10))
        goto LAB_007ce380;
        dVar1 = (par2->genes).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                m_storage.m_data[uVar10];
        auVar26._8_8_ = 0;
        auVar26._0_8_ =
             (par1->genes).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_data[uVar10];
        auVar2._8_8_ = 0;
        auVar2._0_8_ = dVar12;
        auVar32._8_8_ = 0;
        auVar32._0_8_ = (1.0 - dVar12) * dVar1;
        auVar19 = vfmadd231sd_fma(auVar32,auVar26,auVar2);
        pdVar6[uVar10] = auVar19._0_8_;
        if ((~((long)uVar5 >> 0x3f) & uVar5) == uVar10) goto LAB_007ce380;
        auVar29._8_8_ = 0;
        auVar29._0_8_ = (1.0 - auVar15._0_8_) * dVar1;
        auVar19 = vfmadd213sd_fma(auVar26,auVar15._0_16_,auVar29);
        pdVar7[uVar10] = auVar19._0_8_;
        uVar10 = uVar10 + 1;
      } while ((uVar9 & 0x7fffffff) != uVar10);
    }
    break;
  case HEURISTIC:
    pCVar11 = par2;
    if (par1->fitness < par2->fitness) {
      pCVar11 = par1;
      par1 = par2;
    }
    if (0 < (int)uVar9) {
      uVar8 = 0;
      do {
        if (((par1->genes).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_rows <= (long)uVar8) ||
           ((pCVar11->genes).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
            m_storage.m_rows <= (long)uVar8)) goto LAB_007ce380;
        dVar12 = (par1->genes).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                 m_storage.m_data[uVar8];
        dVar1 = (pCVar11->genes).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                m_storage.m_data[uVar8];
        auVar16._0_8_ = ChRandom();
        auVar16._8_56_ = extraout_var_01;
        if ((child1->genes).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
            .m_rows <= (long)uVar8) goto LAB_007ce380;
        auVar19._8_8_ = 0;
        auVar19._0_8_ = dVar12;
        dVar1 = dVar12 - dVar1;
        auVar27._8_8_ = 0;
        auVar27._0_8_ = (this->super_ChOptimizer).xv_sup[uVar8];
        auVar22._8_8_ = 0;
        auVar22._0_8_ = dVar1;
        auVar19 = vfmadd213sd_fma(auVar16._0_16_,auVar22,auVar19);
        auVar23._8_8_ = 0;
        auVar23._0_8_ = (this->super_ChOptimizer).xv_inf[uVar8];
        auVar19 = vminsd_avx(auVar27,auVar19);
        auVar19 = vmaxsd_avx(auVar23,auVar19);
        (child1->genes).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
        m_data[uVar8] = auVar19._0_8_;
        auVar17._0_8_ = ChRandom();
        auVar17._8_56_ = extraout_var_02;
        if ((child2->genes).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
            .m_rows <= (long)uVar8) goto LAB_007ce380;
        auVar20._8_8_ = 0;
        auVar20._0_8_ = dVar1;
        auVar3._8_8_ = 0;
        auVar3._0_8_ = dVar12;
        auVar19 = vfmadd213sd_fma(auVar20,auVar17._0_16_,auVar3);
        auVar13._8_8_ = 0;
        auVar13._0_8_ = (this->super_ChOptimizer).xv_sup[uVar8];
        auVar24._8_8_ = 0;
        auVar24._0_8_ = (this->super_ChOptimizer).xv_inf[uVar8];
        auVar19 = vminsd_avx(auVar13,auVar19);
        auVar19 = vmaxsd_avx(auVar24,auVar19);
        (child2->genes).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
        m_data[uVar8] = auVar19._0_8_;
        uVar8 = uVar8 + 1;
      } while ((uVar9 & 0x7fffffff) != uVar8);
    }
    break;
  case DISABLED:
    ChGenotype::Copy(child1,par1);
    ChGenotype::Copy(child2,par2);
    local_54 = false;
  }
  child1->need_eval = local_54;
  child2->need_eval = local_54;
  if (local_48.m_data != (double *)0x0) {
    free((void *)local_48.m_data[-1]);
  }
  return;
}

Assistant:

void ChOptimizerGenetic::ApplyCrossover(ChGenotype* par1, ChGenotype* par2, ChGenotype& child1, ChGenotype& child2) {
    int nvars = (int)par1->genes.size();
    int mv;
    double fen1, fen2, newfen1, newfen2, w1, w2;
    ChMatrixDynamic<> mtemp(nvars, 1);

    switch (crossover) {
        case CrossoverType::DISABLED:
            // do not perform crossover, return same as parent without need of evaluation
            child1.Copy(par1);
            child2.Copy(par2);
            child1.need_eval = false;
            child2.need_eval = false;
            return;  // %%%%

        case CrossoverType::ARITMETIC:
            // 'Arithmetic' crossover:
            // average of fenotypes with random wheight
            for (mv = 0; mv < nvars; mv++) {
                w1 = ChRandom();
                w2 = ChRandom();
                fen1 = par1->genes(mv);
                fen2 = par2->genes(mv);
                newfen1 = fen1 * w1 + fen2 * (1 - w1);
                newfen2 = fen1 * w2 + fen2 * (1 - w2);
                child1.genes(mv) = newfen1;
                child2.genes(mv) = newfen2;
            }
            break;

        case CrossoverType::BLEND:
            // 'Blend' crossover:
            // linear average of two fenotypes with constant weights 0.3 and 0.7 (children are linear
            // interpolation of parents 0...0.3...0.7...1)
            w1 = 0.3;
            w2 = 0.7;
            for (mv = 0; mv < nvars; mv++) {
                fen1 = par1->genes(mv);
                fen2 = par2->genes(mv);
                newfen1 = fen1 * w1 + fen2 * (1 - w1);
                newfen2 = fen1 * w2 + fen2 * (1 - w2);
                child1.genes(mv) = newfen1;
                child2.genes(mv) = newfen2;
            }
            break;
        case CrossoverType::BLEND_RANDOM:
            // 'Blend random' crossover:
            // linear average of two fenotypes with random weights 0.3 and 0.7 (children are linear
            // interpolation of parents 0...rnd...rnd...1)
            w1 = ChRandom();
            w2 = ChRandom();
            for (mv = 0; mv < nvars; mv++) {
                fen1 = par1->genes(mv);
                fen2 = par2->genes(mv);
                newfen1 = fen1 * w1 + fen2 * (1 - w1);
                newfen2 = fen1 * w2 + fen2 * (1 - w2);
                child1.genes(mv) = newfen1;
                child2.genes(mv) = newfen2;
            }
            break;
        case CrossoverType::HEURISTIC:
            // 'heuristic crossover' extrapolates the child in the direction of
            // the parent with best fitness
            ChGenotype* lead_par;
            ChGenotype* slave_par;
            if (par1->fitness >= par2->fitness) {
                lead_par = par1;
                slave_par = par2;
            } else {
                lead_par = par2;
                slave_par = par1;
            }

            for (mv = 0; mv < nvars; mv++) {
                fen1 = lead_par->genes(mv);
                fen2 = slave_par->genes(mv);

                w1 = ChRandom();
                newfen1 = fen1 + w1 * (fen1 - fen2);
                if (newfen1 > xv_sup[mv])
                    newfen1 = xv_sup[mv];
                if (newfen1 < xv_inf[mv])
                    newfen1 = xv_inf[mv];
                child1.genes(mv) = newfen1;

                w2 = ChRandom();
                newfen2 = fen1 + w2 * (fen1 - fen2);
                if (newfen2 > xv_sup[mv])
                    newfen2 = xv_sup[mv];
                if (newfen2 < xv_inf[mv])
                    newfen2 = xv_inf[mv];
                child2.genes(mv) = newfen2;
            }
            break;

        default:
            break;
    }

    // set flags: the chromosomes has been changed,
    // and fitness should be computed!
    child1.need_eval = true;
    child2.need_eval = true;
}